

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O1

AggregateFunction * __thiscall
duckdb::GetTypedReservoirQuantileListAggregateFunction<signed_char,signed_char>
          (AggregateFunction *__return_storage_ptr__,duckdb *this,LogicalType *type)

{
  initializer_list<duckdb::LogicalType> __l;
  LogicalType result_type;
  allocator_type local_59;
  LogicalType local_58;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_40;
  LogicalType local_28;
  
  LogicalType::LIST(&local_28,(LogicalType *)this);
  LogicalType::LogicalType(&local_58,(LogicalType *)this);
  __l._M_len = 1;
  __l._M_array = &local_58;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_40,__l,&local_59);
  AggregateFunction::AggregateFunction
            (__return_storage_ptr__,(vector<duckdb::LogicalType,_true> *)&local_40,&local_28,
             AggregateFunction::StateSize<duckdb::ReservoirQuantileState<signed_char>>,
             AggregateFunction::
             StateInitialize<duckdb::ReservoirQuantileState<signed_char>,duckdb::ReservoirQuantileListOperation<signed_char>,(duckdb::AggregateDestructorType)0>
             ,AggregateFunction::
              UnaryScatterUpdate<duckdb::ReservoirQuantileState<signed_char>,signed_char,duckdb::ReservoirQuantileListOperation<signed_char>>
             ,AggregateFunction::
              StateCombine<duckdb::ReservoirQuantileState<signed_char>,duckdb::ReservoirQuantileListOperation<signed_char>>
             ,AggregateFunction::
              StateFinalize<duckdb::ReservoirQuantileState<signed_char>,duckdb::list_entry_t,duckdb::ReservoirQuantileListOperation<signed_char>>
             ,AggregateFunction::
              UnaryUpdate<duckdb::ReservoirQuantileState<signed_char>,signed_char,duckdb::ReservoirQuantileListOperation<signed_char>>
             ,(bind_aggregate_function_t)0x0,
             AggregateFunction::
             StateDestroy<duckdb::ReservoirQuantileState<signed_char>,duckdb::ReservoirQuantileListOperation<signed_char>>
             ,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_40);
  LogicalType::~LogicalType(&local_58);
  LogicalType::~LogicalType(&local_28);
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetTypedReservoirQuantileListAggregateFunction(const LogicalType &type) {
	using STATE = ReservoirQuantileState<SAVE_TYPE>;
	using OP = ReservoirQuantileListOperation<INPUT_TYPE>;
	auto fun = ReservoirQuantileListAggregate<STATE, INPUT_TYPE, list_entry_t, OP>(type, type);
	return fun;
}